

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::ArrayMapMethod::ArrayMapMethod(ArrayMapMethod *this)

{
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__ArrayMapMethod_00dc4000;
  *(undefined4 *)((long)in_RDI + 0x34) = 1;
  return;
}

Assistant:

ArrayMapMethod() : SystemSubroutine(KnownSystemName::Map, SubroutineKind::Function) {
        withClauseMode = WithClauseMode::Iterator;
    }